

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::enter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxId *enterId,bool polish)

{
  uint *puVar1;
  undefined8 *puVar2;
  double a;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  int *piVar8;
  pointer pnVar9;
  undefined8 uVar10;
  Item *pIVar11;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar12;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar13;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar14;
  uint uVar15;
  uint uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar19;
  int32_t iVar20;
  undefined1 auVar21 [16];
  DataKey *pDVar22;
  bool bVar23;
  int iVar24;
  uint uVar25;
  undefined4 extraout_var;
  double *pdVar26;
  SPxOut *pSVar27;
  _func_int **pp_Var28;
  cpp_dec_float<50U,_int,_void> *pcVar29;
  long lVar30;
  undefined7 in_register_00000011;
  cpp_dec_float<50U,_int,_void> *pcVar31;
  fpclass_type fVar32;
  ulong uVar33;
  ulong uVar34;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar35;
  DataKey DVar36;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar37;
  pointer pUVar38;
  uint uVar39;
  ulong uVar40;
  bool bVar41;
  Real RVar42;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Status enterStat;
  DataKey *local_778;
  ulong local_770;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  SPxId none;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterTest;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterMax;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterRO;
  cpp_dec_float<50U,_int,_void> local_568;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  uint local_4e8 [6];
  undefined5 uStack_4d0;
  undefined3 uStack_4cb;
  undefined5 local_4c8;
  undefined3 uStack_4c3;
  int local_4c0;
  undefined1 local_4bc;
  undefined8 local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterLB;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterUB;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  undefined8 local_3e8;
  uint auStack_3e0 [4];
  undefined5 uStack_3d0;
  undefined3 uStack_3cb;
  uint local_3c8;
  undefined3 uStack_3c3;
  int local_3c0;
  byte local_3bc;
  undefined8 local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  uint local_328 [2];
  uint auStack_320 [2];
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  undefined8 local_308;
  int local_300;
  undefined1 local_2fc;
  fpclass_type local_2f8;
  int32_t iStack_2f4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  uint local_2a8 [2];
  uint auStack_2a0 [2];
  uint local_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  undefined8 local_288;
  int local_280;
  undefined1 local_27c;
  fpclass_type local_278;
  int32_t iStack_274;
  cpp_dec_float<50U,_int,_void> local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8 [2];
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  undefined8 local_148;
  int local_140;
  undefined1 local_13c;
  fpclass_type local_138;
  int32_t iStack_134;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  fpclass_type local_78;
  int32_t iStack_74;
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  enterTest.m_backend.fpclass = cpp_dec_float_finite;
  enterTest.m_backend.prec_elem = 10;
  enterTest.m_backend.data._M_elems[0] = 0;
  enterTest.m_backend.data._M_elems[1] = 0;
  enterTest.m_backend.data._M_elems[2] = 0;
  enterTest.m_backend.data._M_elems[3] = 0;
  enterTest.m_backend.data._M_elems[4] = 0;
  enterTest.m_backend.data._M_elems[5] = 0;
  enterTest.m_backend.data._M_elems[6] = 0;
  enterTest.m_backend.data._M_elems[7] = 0;
  enterTest.m_backend.data._M_elems._32_5_ = 0;
  enterTest.m_backend.data._M_elems[9]._1_3_ = 0;
  enterTest.m_backend.exp = 0;
  enterTest.m_backend.neg = false;
  enterUB.m_backend.fpclass = cpp_dec_float_finite;
  enterUB.m_backend.prec_elem = 10;
  enterUB.m_backend.data._M_elems[0] = 0;
  enterUB.m_backend.data._M_elems[1] = 0;
  enterUB.m_backend.data._M_elems[2] = 0;
  enterUB.m_backend.data._M_elems[3] = 0;
  enterUB.m_backend.data._M_elems[4] = 0;
  enterUB.m_backend.data._M_elems[5] = 0;
  enterUB.m_backend.data._M_elems._24_5_ = 0;
  enterUB.m_backend.data._M_elems[7]._1_3_ = 0;
  enterUB.m_backend.data._M_elems._32_5_ = 0;
  enterUB.m_backend.data._M_elems[9]._1_3_ = 0;
  enterUB.m_backend.exp = 0;
  enterUB.m_backend.neg = false;
  enterLB.m_backend.fpclass = cpp_dec_float_finite;
  enterLB.m_backend.prec_elem = 10;
  enterLB.m_backend.data._M_elems[0] = 0;
  enterLB.m_backend.data._M_elems[1] = 0;
  enterLB.m_backend.data._M_elems[2] = 0;
  enterLB.m_backend.data._M_elems[3] = 0;
  enterLB.m_backend.data._M_elems[4] = 0;
  enterLB.m_backend.data._M_elems[5] = 0;
  enterLB.m_backend.data._M_elems._24_5_ = 0;
  enterLB.m_backend.data._M_elems[7]._1_3_ = 0;
  enterLB.m_backend.data._M_elems._32_5_ = 0;
  enterLB.m_backend.data._M_elems[9]._1_3_ = 0;
  enterLB.m_backend.exp = 0;
  enterLB.m_backend.neg = false;
  enterVal.m_backend.fpclass = cpp_dec_float_finite;
  enterVal.m_backend.prec_elem = 10;
  enterVal.m_backend.data._M_elems[0] = 0;
  enterVal.m_backend.data._M_elems[1] = 0;
  enterVal.m_backend.data._M_elems[2] = 0;
  enterVal.m_backend.data._M_elems[3] = 0;
  enterVal.m_backend.data._M_elems[4] = 0;
  enterVal.m_backend.data._M_elems[5] = 0;
  enterVal.m_backend.data._M_elems._24_5_ = 0;
  enterVal.m_backend.data._M_elems[7]._1_3_ = 0;
  enterVal.m_backend.data._M_elems._32_5_ = 0;
  enterVal.m_backend.data._M_elems[9]._1_3_ = 0;
  enterVal.m_backend.exp = 0;
  enterVal.m_backend.neg = false;
  enterMax.m_backend.fpclass = cpp_dec_float_finite;
  enterMax.m_backend.prec_elem = 10;
  enterMax.m_backend.data._M_elems[0] = 0;
  enterMax.m_backend.data._M_elems[1] = 0;
  enterMax.m_backend.data._M_elems[2] = 0;
  enterMax.m_backend.data._M_elems[3] = 0;
  enterMax.m_backend.data._M_elems[4] = 0;
  enterMax.m_backend.data._M_elems[5] = 0;
  enterMax.m_backend.data._M_elems[6] = 0;
  enterMax.m_backend.data._M_elems[7] = 0;
  enterMax.m_backend.data._M_elems._32_5_ = 0;
  enterMax.m_backend.data._M_elems[9]._1_3_ = 0;
  enterMax.m_backend.exp = 0;
  enterMax.m_backend.neg = false;
  local_568.fpclass = cpp_dec_float_finite;
  local_568.prec_elem = 10;
  local_568.data._M_elems[0] = 0;
  local_568.data._M_elems[1] = 0;
  local_568.data._M_elems[2] = 0;
  local_568.data._M_elems[3] = 0;
  local_568.data._M_elems[4] = 0;
  local_568.data._M_elems[5] = 0;
  local_568.data._M_elems._24_5_ = 0;
  local_568.data._M_elems[7]._1_3_ = 0;
  local_568.data._M_elems._32_5_ = 0;
  local_568.data._M_elems[9]._1_3_ = 0;
  local_568.exp = 0;
  local_568.neg = false;
  enterRO.m_backend.fpclass = cpp_dec_float_finite;
  enterRO.m_backend.prec_elem = 10;
  enterRO.m_backend.data._M_elems[0] = 0;
  enterRO.m_backend.data._M_elems[1] = 0;
  enterRO.m_backend.data._M_elems[2] = 0;
  enterRO.m_backend.data._M_elems[3] = 0;
  enterRO.m_backend.data._M_elems[4] = 0;
  enterRO.m_backend.data._M_elems[5] = 0;
  enterRO.m_backend.data._M_elems._24_5_ = 0;
  enterRO.m_backend.data._M_elems[7]._1_3_ = 0;
  enterRO.m_backend.data._M_elems._32_5_ = 0;
  enterRO.m_backend.data._M_elems[9]._1_3_ = 0;
  enterRO.m_backend.exp = 0;
  enterRO.m_backend.neg = false;
  local_4b8._0_4_ = cpp_dec_float_finite;
  local_4b8._4_4_ = 10;
  local_4e8[0] = 0;
  local_4e8[1] = 0;
  local_4e8[2] = 0;
  local_4e8[3] = 0;
  local_4e8[4] = 0;
  local_4e8[5] = 0;
  uStack_4d0 = 0;
  uStack_4cb = 0;
  local_4c8 = 0;
  uStack_4c3 = 0;
  local_4c0 = 0;
  local_4bc = 0;
  iVar24 = (*(this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._vptr_ClassArray[0x7e])();
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(extraout_var,iVar24);
  local_770 = CONCAT71(local_770._1_7_,this->instableEnter);
  local_778 = &enterId->super_DataKey;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,&local_568
             ,&enterStat,&enterRO,local_4e8);
  uVar10 = result.m_backend._48_8_;
  if ((int)CONCAT71(in_register_00000011,polish) == 0) {
    RVar42 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_1,RVar42);
    result.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    auVar21 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
    result.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
    result.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
    result.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
    result.m_backend.exp = result_1.m_backend.exp;
    result.m_backend.neg = result_1.m_backend.neg;
    uVar10._0_4_ = result_1.m_backend.fpclass;
    uVar10._4_4_ = result_1.m_backend.prec_elem;
    result.m_backend.fpclass = result_1.m_backend.fpclass;
    result.m_backend.prec_elem = result_1.m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    if (result.m_backend.data._M_elems[0] != 0 || result_1.m_backend.fpclass != cpp_dec_float_finite
       ) {
      result.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
    }
    result.m_backend.data._M_elems._0_16_ = auVar21;
    if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
        (uVar10 = result.m_backend._48_8_, enterTest.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&enterTest.m_backend,&result.m_backend),
       uVar10 = result.m_backend._48_8_, 0 < iVar24)) {
      local_48 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                          enterTest.m_backend.data._M_elems._32_5_);
      local_58 = enterTest.m_backend.data._M_elems[4];
      uStack_54 = enterTest.m_backend.data._M_elems[5];
      uStack_50 = enterTest.m_backend.data._M_elems[6];
      uStack_4c = enterTest.m_backend.data._M_elems[7];
      local_68[0] = enterTest.m_backend.data._M_elems[0];
      local_68[1] = enterTest.m_backend.data._M_elems[1];
      auStack_60[0] = enterTest.m_backend.data._M_elems[2];
      auStack_60[1] = enterTest.m_backend.data._M_elems[3];
      local_40 = enterTest.m_backend.exp;
      local_3c = enterTest.m_backend.neg;
      local_38 = enterTest.m_backend.fpclass;
      iStack_34 = enterTest.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this,*local_778,local_68,(ulong)(uint)enterStat);
      pp_Var28 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxBasisBase;
      bVar41 = false;
      goto LAB_00283653;
    }
  }
  result.m_backend._48_8_ = uVar10;
  pUVar35 = this->theFvec;
  if (((pUVar35->thedelta).setupStatus == true) && ((pUVar35->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solve4update(&this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&pUVar35->thedelta,rhs);
  }
  if ((!polish) && (this->m_maxCycle < this->m_numCycle)) {
    result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar10 = result_1.m_backend.data._M_elems._0_8_;
    result_1.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result_1.m_backend.data._M_elems._32_5_ = enterMax.m_backend.data._M_elems._32_5_;
    result_1.m_backend.data._M_elems[9]._1_3_ = enterMax.m_backend.data._M_elems[9]._1_3_;
    result_1.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result_1.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result_1.m_backend.exp = enterMax.m_backend.exp;
    result_1.m_backend.neg = enterMax.m_backend.neg;
    result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems._0_8_ = uVar10;
    if ((result_1.m_backend.data._M_elems[0] == 0 &&
         enterMax.m_backend.fpclass == cpp_dec_float_finite) ||
       (result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1),
       enterMax.m_backend.fpclass != cpp_dec_float_NaN)) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&result.m_backend,0,(type *)0x0);
      iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&result_1.m_backend,&result.m_backend);
      lVar30 = 0x450;
      if (iVar24 < 1) goto LAB_00282b56;
    }
    else {
LAB_00282b56:
      lVar30 = 0x448;
    }
    (**(code **)((long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._vptr_ClassArray + lVar30))(this);
  }
  result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
  result_1.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
  uVar10 = result_1.m_backend.data._M_elems._0_8_;
  result_1.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
  result_1.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
  result_1.m_backend.data._M_elems._32_5_ = enterMax.m_backend.data._M_elems._32_5_;
  result_1.m_backend.data._M_elems[9]._1_3_ = enterMax.m_backend.data._M_elems[9]._1_3_;
  result_1.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
  result_1.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
  result_1.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
  result_1.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
  result_1.m_backend.exp = enterMax.m_backend.exp;
  result_1.m_backend.neg = enterMax.m_backend.neg;
  result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
  result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
  result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
  if (enterMax.m_backend.fpclass != cpp_dec_float_finite || result_1.m_backend.data._M_elems[0] != 0
     ) {
    result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
  }
  this->boundflips = 0;
  local_88 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                      enterTest.m_backend.data._M_elems._32_5_);
  local_98 = enterTest.m_backend.data._M_elems[4];
  uStack_94 = enterTest.m_backend.data._M_elems[5];
  uStack_90 = enterTest.m_backend.data._M_elems[6];
  uStack_8c = enterTest.m_backend.data._M_elems[7];
  local_a8[0] = enterTest.m_backend.data._M_elems[0];
  local_a8[1] = enterTest.m_backend.data._M_elems[1];
  auStack_a0[0] = enterTest.m_backend.data._M_elems[2];
  auStack_a0[1] = enterTest.m_backend.data._M_elems[3];
  local_80 = enterTest.m_backend.exp;
  local_7c = enterTest.m_backend.neg;
  local_78 = enterTest.m_backend.fpclass;
  iStack_74 = enterTest.m_backend.prec_elem;
  result_1.m_backend.data._M_elems._0_8_ = uVar10;
  uVar25 = (*this->theratiotester->_vptr_SPxRatioTester[7])();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(this->instableEnterVal).m_backend,0);
  (this->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
  this->instableEnter = false;
  bVar41 = -1 < (int)uVar25;
  if (!bVar41) {
    local_428.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
    local_428.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
    local_428.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
    local_428.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
    local_428.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    local_428.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    local_428.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    local_428.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    local_428.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    local_428.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    local_428.m_backend.exp = result_1.m_backend.exp;
    local_428.m_backend.neg = result_1.m_backend.neg;
    local_428.m_backend.fpclass = result_1.m_backend.fpclass;
    local_428.m_backend.prec_elem = result_1.m_backend.prec_elem;
    result_16.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result_16.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result_16.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_16.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar10 = result_16.m_backend.data._M_elems._0_8_;
    result_16.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result_16.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result_16.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result_16.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result_16.m_backend.data._M_elems[9]._1_3_ = enterMax.m_backend.data._M_elems[9]._1_3_;
    result_16.m_backend.data._M_elems._32_5_ = enterMax.m_backend.data._M_elems._32_5_;
    result_16.m_backend.exp = enterMax.m_backend.exp;
    result_16.m_backend.neg = enterMax.m_backend.neg;
    result_16.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_16.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result_16.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
        result_16.m_backend.data._M_elems[0] != 0) {
      result_16.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    result_16.m_backend.data._M_elems._0_8_ = uVar10;
    RVar42 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar23 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_428,&result_16,RVar42);
    if (!bVar23) {
      if (!polish) {
        ::soplex::infinity::__tls_init();
        pdVar26 = (double *)__tls_get_addr(&PTR_003b4b70);
        a = *pdVar26;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result,a);
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_1.m_backend,&result.m_backend), iVar24 < 0)) {
          ::soplex::infinity::__tls_init();
          leavebound.m_backend.fpclass = cpp_dec_float_finite;
          leavebound.m_backend.prec_elem = 10;
          leavebound.m_backend.data._M_elems[0] = 0;
          leavebound.m_backend.data._M_elems[1] = 0;
          leavebound.m_backend.data._M_elems[2] = 0;
          leavebound.m_backend.data._M_elems[3] = 0;
          leavebound.m_backend.data._M_elems[4] = 0;
          leavebound.m_backend.data._M_elems[5] = 0;
          leavebound.m_backend.data._M_elems[6] = 0;
          leavebound.m_backend.data._M_elems[7] = 0;
          leavebound.m_backend.data._M_elems._32_5_ = 0;
          leavebound.m_backend.data._M_elems[9]._1_3_ = 0;
          leavebound.m_backend.exp = 0;
          leavebound.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&leavebound,-a);
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&result_1.m_backend,&leavebound.m_backend), pDVar22 = local_778,
             0 < iVar24)) {
            (**(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase)
                      (&this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,0xffffffff,local_778,rhs,0);
            pUVar35 = this->theFvec;
            *(ulong *)((pUVar35->theval).m_backend.data._M_elems + 8) =
                 CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                          result_1.m_backend.data._M_elems._32_5_);
            *(undefined8 *)((pUVar35->theval).m_backend.data._M_elems + 4) =
                 result_1.m_backend.data._M_elems._16_8_;
            *(ulong *)((pUVar35->theval).m_backend.data._M_elems + 6) =
                 CONCAT44(result_1.m_backend.data._M_elems[7],result_1.m_backend.data._M_elems[6]);
            *(undefined8 *)(pUVar35->theval).m_backend.data._M_elems =
                 result_1.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((pUVar35->theval).m_backend.data._M_elems + 2) =
                 result_1.m_backend.data._M_elems._8_8_;
            (pUVar35->theval).m_backend.exp = result_1.m_backend.exp;
            (pUVar35->theval).m_backend.neg = result_1.m_backend.neg;
            (pUVar35->theval).m_backend.fpclass = result_1.m_backend.fpclass;
            (pUVar35->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
            pUVar35 = this->theFvec;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)pUVar35,&pUVar35->theval,&pUVar35->thedelta);
            local_288 = CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                                 result_1.m_backend.data._M_elems._32_5_);
            local_298 = result_1.m_backend.data._M_elems[4];
            uStack_294 = result_1.m_backend.data._M_elems[5];
            uStack_290 = result_1.m_backend.data._M_elems[6];
            uStack_28c = result_1.m_backend.data._M_elems[7];
            local_2a8[0] = result_1.m_backend.data._M_elems[0];
            local_2a8[1] = result_1.m_backend.data._M_elems[1];
            auStack_2a0[0] = result_1.m_backend.data._M_elems[2];
            auStack_2a0[1] = result_1.m_backend.data._M_elems[3];
            local_280 = result_1.m_backend.exp;
            local_27c = result_1.m_backend.neg;
            local_278 = result_1.m_backend.fpclass;
            iStack_274 = result_1.m_backend.prec_elem;
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x83])(this,*pDVar22,(ulong)(uint)enterStat,local_2a8,rhs,local_4e8)
            ;
            local_2e8.m_backend.data._M_elems[9]._1_3_ = uStack_4c3;
            local_2e8.m_backend.data._M_elems._32_5_ = local_4c8;
            local_2e8.m_backend.data._M_elems[7]._1_3_ = uStack_4cb;
            local_2e8.m_backend.data._M_elems._24_5_ = uStack_4d0;
            local_2e8.m_backend.data._M_elems[4] = local_4e8[4];
            local_2e8.m_backend.data._M_elems[5] = local_4e8[5];
            local_2e8.m_backend.data._M_elems[0] = local_4e8[0];
            local_2e8.m_backend.data._M_elems[1] = local_4e8[1];
            local_2e8.m_backend.data._M_elems[2] = local_4e8[2];
            local_2e8.m_backend.data._M_elems[3] = local_4e8[3];
            local_2e8.m_backend.exp = local_4c0;
            local_2e8.m_backend.neg = (bool)local_4bc;
            local_2e8.m_backend.fpclass = (fpclass_type)local_4b8;
            local_2e8.m_backend.prec_elem = local_4b8._4_4_;
            updateNonbasicValue(this,&local_2e8);
            return bVar41;
          }
        }
      }
      local_308 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                           enterTest.m_backend.data._M_elems._32_5_);
      local_318 = enterTest.m_backend.data._M_elems[4];
      uStack_314 = enterTest.m_backend.data._M_elems[5];
      uStack_310 = enterTest.m_backend.data._M_elems[6];
      uStack_30c = enterTest.m_backend.data._M_elems[7];
      local_328[0] = enterTest.m_backend.data._M_elems[0];
      local_328[1] = enterTest.m_backend.data._M_elems[1];
      auStack_320[0] = enterTest.m_backend.data._M_elems[2];
      auStack_320[1] = enterTest.m_backend.data._M_elems[3];
      local_300 = enterTest.m_backend.exp;
      local_2fc = enterTest.m_backend.neg;
      local_2f8 = enterTest.m_backend.fpclass;
      iStack_2f4 = enterTest.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this,*local_778,local_328,(ulong)(uint)enterStat);
      (**(this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (&this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffff,&none,0,0);
      if (polish) {
        return bVar41;
      }
      if (1 < (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).updateCount) {
        pSVar27 = this->spxout;
        if ((pSVar27 != (SPxOut *)0x0) && (4 < (int)pSVar27->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar27->m_verbosity;
          leavebound.m_backend.data._M_elems[0] = 5;
          (*pSVar27->_vptr_SPxOut[2])();
          pSVar27 = operator<<(this->spxout,"IENTER01 factorization triggered in ");
          pSVar27 = operator<<(pSVar27,"enter() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar27->m_streams[pSVar27->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result);
        }
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x75])(this);
        return bVar41;
      }
      result.m_backend.data._M_elems._32_5_ = enterTest.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[9]._1_3_ = enterTest.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.data._M_elems[4] = enterTest.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = enterTest.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems[6] = enterTest.m_backend.data._M_elems[6];
      result.m_backend.data._M_elems[7] = enterTest.m_backend.data._M_elems[7];
      result.m_backend.data._M_elems[2] = enterTest.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = enterTest.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[0] = enterTest.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = enterTest.m_backend.data._M_elems[1];
      auVar21 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
      result.m_backend.exp = enterTest.m_backend.exp;
      result.m_backend.neg = enterTest.m_backend.neg;
      result.m_backend.fpclass = enterTest.m_backend.fpclass;
      result.m_backend.prec_elem = enterTest.m_backend.prec_elem;
      fVar32 = enterTest.m_backend.fpclass;
      if ((enterTest.m_backend.neg == true) &&
         (result.m_backend.data._M_elems[0] = enterTest.m_backend.data._M_elems[0],
         result.m_backend.data._M_elems[0] != 0 || fVar32 != cpp_dec_float_finite)) {
        result.m_backend.neg = false;
      }
      result.m_backend.data._M_elems._0_16_ = auVar21;
      entertol(&leavebound,this);
      if (((fVar32 != cpp_dec_float_NaN) && (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&result.m_backend,&leavebound.m_backend), iVar24 < 0)) {
        pSVar27 = this->spxout;
        if ((pSVar27 != (SPxOut *)0x0) && (4 < (int)pSVar27->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar27->m_verbosity;
          leavebound.m_backend.data._M_elems[0] = 5;
          (*pSVar27->_vptr_SPxOut[2])();
          pSVar27 = operator<<(this->spxout,"IENTER11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar27->m_streams[pSVar27->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result);
        }
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coSolve(&this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,this->theCoPrhs);
        computePvec(this);
        computeCoTest(this);
        computeTest(this);
        return bVar41;
      }
      pSVar27 = this->spxout;
      if ((pSVar27 != (SPxOut *)0x0) && (4 < (int)pSVar27->m_verbosity)) {
        result.m_backend.data._M_elems[0] = pSVar27->m_verbosity;
        leavebound.m_backend.data._M_elems[0] = 5;
        (*pSVar27->_vptr_SPxOut[2])();
        pSVar27 = operator<<(this->spxout,"IENTER02 unboundedness/infeasibility found in ");
        pSVar27 = operator<<(pSVar27,"enter()");
        std::endl<char,std::char_traits<char>>(pSVar27->m_streams[pSVar27->m_verbosity]);
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result);
      }
      if (this->theRep != ROW) {
        local_3a8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
        local_3a8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
        local_3a8.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
        local_3a8.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
        local_3a8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_3a8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_3a8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_3a8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_3a8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_3a8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_3a8.m_backend.exp = result_1.m_backend.exp;
        local_3a8.m_backend.neg = result_1.m_backend.neg;
        local_3a8.m_backend.fpclass = result_1.m_backend.fpclass;
        local_3a8.m_backend.prec_elem = result_1.m_backend.prec_elem;
        computePrimalray4Col(this,&local_3a8,(SPxId)*local_778);
        if (this->m_status == OPTIMAL) {
          this->m_status = UNKNOWN;
        }
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus == UNBOUNDED) {
          return bVar41;
        }
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus = UNBOUNDED;
        return bVar41;
      }
      local_368.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
      local_368.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
      local_368.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
      local_368.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
      local_368.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_368.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_368.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_368.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_368.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_368.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_368.m_backend.exp = result_1.m_backend.exp;
      local_368.m_backend.neg = result_1.m_backend.neg;
      local_368.m_backend.fpclass = result_1.m_backend.fpclass;
      local_368.m_backend.prec_elem = result_1.m_backend.prec_elem;
      computeDualfarkas4Row(this,&local_368,(SPxId)*local_778);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus == INFEASIBLE) {
        return bVar41;
      }
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = INFEASIBLE;
      return bVar41;
    }
    DVar36 = *local_778;
    if ((char)local_770 == '\0') {
      (this->instableEnterId).super_DataKey = DVar36;
      *(ulong *)((this->instableEnterVal).m_backend.data._M_elems + 8) =
           CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                    enterTest.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 4) =
           enterTest.m_backend.data._M_elems._16_8_;
      *(ulong *)((this->instableEnterVal).m_backend.data._M_elems + 6) =
           CONCAT44(enterTest.m_backend.data._M_elems[7],enterTest.m_backend.data._M_elems[6]);
      *(undefined8 *)(this->instableEnterVal).m_backend.data._M_elems =
           enterTest.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 2) =
           enterTest.m_backend.data._M_elems._8_8_;
      (this->instableEnterVal).m_backend.exp = enterTest.m_backend.exp;
      (this->instableEnterVal).m_backend.neg = enterTest.m_backend.neg;
      (this->instableEnterVal).m_backend.fpclass = enterTest.m_backend.fpclass;
      (this->instableEnterVal).m_backend.prec_elem = enterTest.m_backend.prec_elem;
      DVar36 = *local_778;
      pcVar31 = &result_17.m_backend;
      result_17.m_backend.fpclass = cpp_dec_float_finite;
      result_17.m_backend.prec_elem = 10;
      result_17.m_backend.data._M_elems[0] = 0;
      result_17.m_backend.data._M_elems[1] = 0;
      result_17.m_backend.data._M_elems[2] = 0;
      result_17.m_backend.data._M_elems[3] = 0;
      result_17.m_backend.data._M_elems[4] = 0;
      result_17.m_backend.data._M_elems[5] = 0;
      result_17.m_backend.data._M_elems._24_5_ = 0;
      result_17.m_backend.data._M_elems[7]._1_3_ = 0;
      result_17.m_backend.data._M_elems._32_5_ = 0;
      result_17.m_backend._37_8_ = 0;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result.m_backend,10.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (pcVar31,&enterTest.m_backend,&result.m_backend);
      pp_Var28 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    else {
      local_268.data._M_elems[9]._1_3_ = enterTest.m_backend.data._M_elems[9]._1_3_;
      local_268.data._M_elems._32_5_ = enterTest.m_backend.data._M_elems._32_5_;
      pcVar31 = &local_268;
      local_268.data._M_elems[7] = enterTest.m_backend.data._M_elems[7];
      local_268.data._M_elems[6] = enterTest.m_backend.data._M_elems[6];
      local_268.data._M_elems[4] = enterTest.m_backend.data._M_elems[4];
      local_268.data._M_elems[5] = enterTest.m_backend.data._M_elems[5];
      local_268.data._M_elems[0] = enterTest.m_backend.data._M_elems[0];
      local_268.data._M_elems[1] = enterTest.m_backend.data._M_elems[1];
      local_268.data._M_elems[2] = enterTest.m_backend.data._M_elems[2];
      local_268.data._M_elems[3] = enterTest.m_backend.data._M_elems[3];
      local_268.exp = enterTest.m_backend.exp;
      local_268.neg = enterTest.m_backend.neg;
      local_268.fpclass = enterTest.m_backend.fpclass;
      local_268.prec_elem = enterTest.m_backend.prec_elem;
      pp_Var28 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    (*pp_Var28[0x84])(this,DVar36,pcVar31,(ulong)(uint)enterStat);
    pp_Var28 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
LAB_00283653:
    (**pp_Var28)(&this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffff,&none,0,0);
    return bVar41;
  }
  result.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
  result.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
  result.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
  result.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
  result.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
  result.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
  result.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
  result.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
  result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
  result.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
  auVar21 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
  result.m_backend.exp = result_1.m_backend.exp;
  result.m_backend.neg = result_1.m_backend.neg;
  result.m_backend.fpclass = result_1.m_backend.fpclass;
  result.m_backend.prec_elem = result_1.m_backend.prec_elem;
  if ((result_1.m_backend.neg == true) &&
     (result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0],
     result_1.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0))
  {
    result.m_backend.neg = false;
  }
  result.m_backend.data._M_elems._0_16_ = auVar21;
  entertol(&leavebound,this);
  local_770 = (ulong)uVar25;
  if (((result.m_backend.fpclass == cpp_dec_float_NaN) ||
      (leavebound.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&result.m_backend,&leavebound.m_backend), -1 < iVar24)) {
    this->m_numCycle = this->m_numCycle / 2;
  }
  else {
    pnVar9 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar9[local_770].m_backend.data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[local_770].m_backend.data;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar9[local_770].m_backend.data._M_elems + 2);
    puVar1 = pnVar9[local_770].m_backend.data._M_elems + 4;
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_e8.m_backend.exp = pnVar9[local_770].m_backend.exp;
    local_e8.m_backend.neg = pnVar9[local_770].m_backend.neg;
    local_e8.m_backend.fpclass = pnVar9[local_770].m_backend.fpclass;
    local_e8.m_backend.prec_elem = pnVar9[local_770].m_backend.prec_elem;
    pnVar9 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar9[local_770].m_backend.data._M_elems + 8);
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[local_770].m_backend.data;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar9[local_770].m_backend.data._M_elems + 2);
    puVar1 = pnVar9[local_770].m_backend.data._M_elems + 4;
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_128.m_backend.exp = pnVar9[local_770].m_backend.exp;
    local_128.m_backend.neg = pnVar9[local_770].m_backend.neg;
    local_128.m_backend.fpclass = pnVar9[local_770].m_backend.fpclass;
    local_128.m_backend.prec_elem = pnVar9[local_770].m_backend.prec_elem;
    RVar42 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar23 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_e8,&local_128,RVar42);
    if (((bVar23) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
      this->m_numCycle = this->m_numCycle + 1;
      this->enterCycles = this->enterCycles + 1;
    }
  }
  pSVar3 = this->coSolveVector2;
  pSVar4 = this->coSolveVector3;
  if (pSVar4 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
    if (pSVar3 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::coSolve(&this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&this->theCoPvec->thedelta,
                &(this->unitVecs).data.
                 super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_770].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    }
    else {
      pUVar35 = this->theCoPvec;
      pSVar4 = this->coSolveVector2rhs;
      pUVar38 = (this->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_770;
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar7 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar7->_vptr_SLinSolver[0x18])(pSVar7,&pUVar35->thedelta,pSVar3,pUVar38,pSVar4);
    }
  }
  else {
    pSVar37 = &this->theCoPvec->thedelta;
    pUVar38 = (this->unitVecs).data.
              super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_770;
    if (pSVar3 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      pSVar3 = this->coSolveVector3rhs;
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar7 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar7->_vptr_SLinSolver[0x18])(pSVar7,pSVar37,pSVar4,pUVar38,pSVar3);
      pSVar3 = this->coSolveVector3;
      pUVar35 = this->theCoPvec;
      if (pSVar3->setupStatus == true) {
        lVar30 = (long)(pSVar3->super_IdxSet).num;
        if (0 < lVar30) {
          uVar33 = lVar30 + 1;
          do {
            piVar8 = (pSVar3->super_IdxSet).idx;
            pnVar9 = (pSVar3->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar24 = piVar8[uVar33 - 2];
            uVar10 = *(undefined8 *)(pnVar9[iVar24].m_backend.data._M_elems + 8);
            result.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
            result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
            result.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])&pnVar9[iVar24].m_backend.data;
            puVar1 = pnVar9[iVar24].m_backend.data._M_elems + 4;
            uVar10 = *(undefined8 *)puVar1;
            uVar17 = *(undefined8 *)(puVar1 + 2);
            result.m_backend.data._M_elems[4] = (uint)uVar10;
            result.m_backend.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
            result.m_backend.data._M_elems[6] = (uint)uVar17;
            result.m_backend.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
            result.m_backend.exp = pnVar9[iVar24].m_backend.exp;
            result.m_backend.neg = pnVar9[iVar24].m_backend.neg;
            result.m_backend.fpclass = pnVar9[iVar24].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar9[iVar24].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&(pUVar35->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar8[uVar33 - 2]].m_backend,
                       &result.m_backend);
            uVar33 = uVar33 - 1;
          } while (1 < uVar33);
        }
      }
      else {
        uVar39 = (int)((long)(pUVar35->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pUVar35->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
        if (0 < (int)uVar39) {
          uVar33 = (ulong)(uVar39 & 0x7fffffff);
          uVar40 = uVar33 + 1;
          lVar30 = uVar33 * 0x38;
          do {
            pnVar9 = (pSVar3->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar10 = *(undefined8 *)((long)pnVar9[-1].m_backend.data._M_elems + lVar30 + 0x20);
            result.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
            result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
            result.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])((long)pnVar9[-1].m_backend.data._M_elems + lVar30);
            puVar2 = (undefined8 *)((long)pnVar9[-1].m_backend.data._M_elems + lVar30 + 0x10);
            uVar10 = *puVar2;
            uVar17 = puVar2[1];
            result.m_backend.data._M_elems[4] = (uint)uVar10;
            result.m_backend.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
            result.m_backend.data._M_elems[6] = (uint)uVar17;
            result.m_backend.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
            result.m_backend.exp = *(int *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar30);
            result.m_backend.neg = *(bool *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar30 + 4U);
            result.m_backend._48_8_ =
                 *(undefined8 *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar30 + 8U);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)
                       ((long)(pUVar35->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                              m_backend.data._M_elems + lVar30),&result.m_backend);
            uVar40 = uVar40 - 1;
            lVar30 = lVar30 + -0x38;
          } while (1 < uVar40);
        }
      }
    }
    else {
      pSVar5 = this->coSolveVector2rhs;
      pSVar6 = this->coSolveVector3rhs;
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar7 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar7->_vptr_SLinSolver[0x1a])(pSVar7,pSVar37,pSVar3,pSVar4,pUVar38,pSVar5,pSVar6);
      pSVar3 = this->coSolveVector3;
      pUVar35 = this->theCoPvec;
      if (pSVar3->setupStatus == true) {
        lVar30 = (long)(pSVar3->super_IdxSet).num;
        if (0 < lVar30) {
          uVar33 = lVar30 + 1;
          do {
            piVar8 = (pSVar3->super_IdxSet).idx;
            pnVar9 = (pSVar3->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar24 = piVar8[uVar33 - 2];
            uVar10 = *(undefined8 *)(pnVar9[iVar24].m_backend.data._M_elems + 8);
            result.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
            result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
            result.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])&pnVar9[iVar24].m_backend.data;
            puVar1 = pnVar9[iVar24].m_backend.data._M_elems + 4;
            uVar10 = *(undefined8 *)puVar1;
            uVar17 = *(undefined8 *)(puVar1 + 2);
            result.m_backend.data._M_elems[4] = (uint)uVar10;
            result.m_backend.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
            result.m_backend.data._M_elems[6] = (uint)uVar17;
            result.m_backend.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
            result.m_backend.exp = pnVar9[iVar24].m_backend.exp;
            result.m_backend.neg = pnVar9[iVar24].m_backend.neg;
            result.m_backend.fpclass = pnVar9[iVar24].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar9[iVar24].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&(pUVar35->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar8[uVar33 - 2]].m_backend,
                       &result.m_backend);
            uVar33 = uVar33 - 1;
          } while (1 < uVar33);
        }
      }
      else {
        uVar39 = (int)((long)(pUVar35->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pUVar35->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
        if (0 < (int)uVar39) {
          uVar33 = (ulong)(uVar39 & 0x7fffffff);
          uVar40 = uVar33 + 1;
          lVar30 = uVar33 * 0x38;
          do {
            pnVar9 = (pSVar3->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar10 = *(undefined8 *)((long)pnVar9[-1].m_backend.data._M_elems + lVar30 + 0x20);
            result.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
            result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
            result.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])((long)pnVar9[-1].m_backend.data._M_elems + lVar30);
            puVar2 = (undefined8 *)((long)pnVar9[-1].m_backend.data._M_elems + lVar30 + 0x10);
            uVar10 = *puVar2;
            uVar17 = puVar2[1];
            result.m_backend.data._M_elems[4] = (uint)uVar10;
            result.m_backend.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
            result.m_backend.data._M_elems[6] = (uint)uVar17;
            result.m_backend.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
            result.m_backend.exp = *(int *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar30);
            result.m_backend.neg = *(bool *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar30 + 4U);
            result.m_backend._48_8_ =
                 *(undefined8 *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar30 + 8U);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)
                       ((long)(pUVar35->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                              m_backend.data._M_elems + lVar30),&result.m_backend);
            uVar40 = uVar40 - 1;
            lVar30 = lVar30 + -0x38;
          } while (1 < uVar40);
        }
      }
    }
  }
  if (0 < this->boundflips) {
    uVar39 = (int)((long)(this->coSolveVector3->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->coSolveVector3->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
    if (0 < (int)uVar39) {
      uVar33 = (ulong)(uVar39 & 0x7fffffff);
      do {
        uVar40 = uVar33 - 1;
        pnVar9 = (this->coSolveVector3->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        result.m_backend.exp = pnVar9[uVar40].m_backend.exp;
        result.m_backend.neg = pnVar9[uVar40].m_backend.neg;
        result.m_backend.fpclass = pnVar9[uVar40].m_backend.fpclass;
        result.m_backend.prec_elem = pnVar9[uVar40].m_backend.prec_elem;
        puVar1 = pnVar9[uVar40].m_backend.data._M_elems + 4;
        uVar17 = *(undefined8 *)puVar1;
        uVar18 = *(undefined8 *)(puVar1 + 2);
        uVar10 = *(undefined8 *)(pnVar9[uVar40].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
        result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        result.m_backend.data._M_elems[4] = (uint)uVar17;
        result.m_backend.data._M_elems[5] = (uint)((ulong)uVar17 >> 0x20);
        result.m_backend.data._M_elems[6] = (uint)uVar18;
        result.m_backend.data._M_elems[7] = (uint)((ulong)uVar18 >> 0x20);
        if ((result.m_backend.neg == true) &&
           (result.m_backend.data._M_elems[0] =
                 (uint)*(undefined8 *)pnVar9[uVar40].m_backend.data._M_elems,
           result.m_backend.fpclass != cpp_dec_float_finite ||
           result.m_backend.data._M_elems[0] != 0)) {
          result.m_backend.neg = false;
        }
        result.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])&pnVar9[uVar40].m_backend.data
        ;
        RVar42 = Tolerances::epsilon((this->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        leavebound.m_backend.fpclass = cpp_dec_float_finite;
        leavebound.m_backend.prec_elem = 10;
        leavebound.m_backend.data._M_elems[0] = 0;
        leavebound.m_backend.data._M_elems[1] = 0;
        leavebound.m_backend.data._M_elems[2] = 0;
        leavebound.m_backend.data._M_elems[3] = 0;
        leavebound.m_backend.data._M_elems[4] = 0;
        leavebound.m_backend.data._M_elems[5] = 0;
        leavebound.m_backend.data._M_elems[6] = 0;
        leavebound.m_backend.data._M_elems[7] = 0;
        leavebound.m_backend.data._M_elems._32_5_ = 0;
        leavebound.m_backend.data._M_elems[9]._1_3_ = 0;
        leavebound.m_backend.exp = 0;
        leavebound.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&leavebound,RVar42);
        if (((result.m_backend.fpclass != cpp_dec_float_NaN) &&
            (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result.m_backend,&leavebound.m_backend), 0 < iVar24)) {
          pUVar35 = this->thePvec;
          pnVar9 = (this->coSolveVector3->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          leavebound.m_backend.exp = pnVar9[uVar40].m_backend.exp;
          leavebound.m_backend.neg = pnVar9[uVar40].m_backend.neg;
          leavebound.m_backend.fpclass = pnVar9[uVar40].m_backend.fpclass;
          leavebound.m_backend.prec_elem = pnVar9[uVar40].m_backend.prec_elem;
          uVar10 = *(undefined8 *)(pnVar9[uVar40].m_backend.data._M_elems + 8);
          leavebound.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[uVar40].m_backend.data;
          leavebound.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar9[uVar40].m_backend.data._M_elems + 2);
          puVar1 = pnVar9[uVar40].m_backend.data._M_elems + 4;
          leavebound.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar17 = *(undefined8 *)(puVar1 + 2);
          leavebound.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
          leavebound.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
          leavebound.m_backend.data._M_elems[6] = (uint)uVar17;
          leavebound.m_backend.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
          if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
              leavebound.m_backend.data._M_elems[0] != 0) {
            leavebound.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
          }
          pIVar11 = (this->thecovectors->set).theitem;
          iVar24 = (this->thecovectors->set).thekey[uVar40].idx;
          lVar30 = (long)pIVar11[iVar24].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          if (0 < lVar30) {
            pIVar11 = pIVar11 + iVar24;
            uVar34 = lVar30 + 1;
            lVar30 = lVar30 * 0x3c;
            do {
              pcVar29 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(pIVar11->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem[-1].val.m_backend.data._M_elems + lVar30);
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              pcVar31 = &leavebound.m_backend;
              if (pcVar29 != &result.m_backend) {
                result.m_backend.data._M_elems._32_5_ = leavebound.m_backend.data._M_elems._32_5_;
                result.m_backend.data._M_elems[9]._1_3_ =
                     leavebound.m_backend.data._M_elems[9]._1_3_;
                result.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
                result.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
                result.m_backend.data._M_elems[6] = leavebound.m_backend.data._M_elems[6];
                result.m_backend.data._M_elems[7] = leavebound.m_backend.data._M_elems[7];
                result.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
                result.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
                result.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
                result.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
                result.m_backend.exp = leavebound.m_backend.exp;
                result.m_backend.neg = leavebound.m_backend.neg;
                result.m_backend.fpclass = leavebound.m_backend.fpclass;
                result.m_backend.prec_elem = leavebound.m_backend.prec_elem;
                pcVar31 = pcVar29;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&result.m_backend,pcVar31);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&(pUVar35->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [*(int *)((long)(&(pIVar11->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            .m_elem[-1].val + 1) + lVar30)].m_backend,
                         &result.m_backend);
              uVar34 = uVar34 - 1;
              lVar30 = lVar30 + -0x3c;
            } while (1 < uVar34);
          }
        }
        bVar23 = 1 < (long)uVar33;
        uVar33 = uVar40;
      } while (bVar23);
    }
    if (local_778->info < 1) {
      pUVar35 = this->thePvec;
      SPxRowId::SPxRowId((SPxRowId *)&result,(SPxId *)local_778);
      pLVar19 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
    }
    else {
      pUVar35 = this->theCoPvec;
      SPxColId::SPxColId((SPxColId *)&result,(SPxId *)local_778);
      pLVar19 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
    }
    iVar24 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(pLVar19->
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).set,(DataKey *)&result);
    pnVar9 = (pUVar35->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_568.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[iVar24].m_backend;
    local_568.data._M_elems._8_8_ = *(undefined8 *)(pnVar9[iVar24].m_backend.data._M_elems + 2);
    puVar1 = pnVar9[iVar24].m_backend.data._M_elems + 4;
    local_568.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    local_568.data._M_elems._24_5_ = SUB85(uVar10,0);
    local_568.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
    uVar10 = *(undefined8 *)(pnVar9[iVar24].m_backend.data._M_elems + 8);
    local_568.data._M_elems._32_5_ = SUB85(uVar10,0);
    local_568.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
    local_568.exp = pnVar9[iVar24].m_backend.exp;
    local_568.neg = pnVar9[iVar24].m_backend.neg;
    local_568.fpclass = pnVar9[iVar24].m_backend.fpclass;
    local_568.prec_elem = pnVar9[iVar24].m_backend.prec_elem;
    this->totalboundflips = this->totalboundflips + this->boundflips;
  }
  uVar33 = local_770;
  pnVar9 = (this->theCoPrhs->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar9[local_770].m_backend.data._M_elems + 8) =
       CONCAT35(enterRO.m_backend.data._M_elems[9]._1_3_,enterRO.m_backend.data._M_elems._32_5_);
  puVar1 = pnVar9[local_770].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = enterRO.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(enterRO.m_backend.data._M_elems[7]._1_3_,enterRO.m_backend.data._M_elems._24_5_);
  *(undefined8 *)&pnVar9[local_770].m_backend.data = enterRO.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar9[local_770].m_backend.data._M_elems + 2) =
       enterRO.m_backend.data._M_elems._8_8_;
  pnVar9[local_770].m_backend.exp = enterRO.m_backend.exp;
  pnVar9[local_770].m_backend.neg = enterRO.m_backend.neg;
  pnVar9[local_770].m_backend.fpclass = enterRO.m_backend.fpclass;
  pnVar9[local_770].m_backend.prec_elem = enterRO.m_backend.prec_elem;
  leavebound.m_backend.data._M_elems._32_5_ = enterRO.m_backend.data._M_elems._32_5_;
  leavebound.m_backend.data._M_elems[9]._1_3_ = enterRO.m_backend.data._M_elems[9]._1_3_;
  leavebound.m_backend.data._M_elems[4] = enterRO.m_backend.data._M_elems[4];
  leavebound.m_backend.data._M_elems[5] = enterRO.m_backend.data._M_elems[5];
  leavebound.m_backend.data._M_elems[6] = enterRO.m_backend.data._M_elems[6];
  leavebound.m_backend.data._M_elems[7] =
       (uint)(CONCAT35(enterRO.m_backend.data._M_elems[7]._1_3_,
                       enterRO.m_backend.data._M_elems._24_5_) >> 0x20);
  leavebound.m_backend.data._M_elems[0] = enterRO.m_backend.data._M_elems[0];
  leavebound.m_backend.data._M_elems[1] = enterRO.m_backend.data._M_elems[1];
  leavebound.m_backend.data._M_elems[2] = enterRO.m_backend.data._M_elems[2];
  leavebound.m_backend.data._M_elems[3] = enterRO.m_backend.data._M_elems[3];
  leavebound.m_backend.exp = enterRO.m_backend.exp;
  leavebound.m_backend.neg = enterRO.m_backend.neg;
  leavebound.m_backend.fpclass = enterRO.m_backend.fpclass;
  leavebound.m_backend.prec_elem = enterRO.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            (&leavebound.m_backend,&local_568);
  pnVar9 = (this->theFvec->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = *(undefined8 *)(pnVar9[uVar33].m_backend.data._M_elems + 8);
  result_11.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
  result_11.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  result_11.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[uVar33].m_backend.data;
  result_11.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar9[uVar33].m_backend.data._M_elems + 2);
  puVar1 = pnVar9[uVar33].m_backend.data._M_elems + 4;
  result_11.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar10 = *(undefined8 *)(puVar1 + 2);
  result_11.m_backend.data._M_elems[6] = (uint)uVar10;
  result_11.m_backend.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
  result_11.m_backend.exp = pnVar9[uVar33].m_backend.exp;
  result_11.m_backend.neg = pnVar9[uVar33].m_backend.neg;
  result_11.m_backend.fpclass = pnVar9[uVar33].m_backend.fpclass;
  result_11.m_backend.prec_elem = pnVar9[uVar33].m_backend.prec_elem;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 10;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems._32_5_ = 0;
  result.m_backend.data._M_elems[9]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result.m_backend,&leavebound.m_backend,&result_11.m_backend);
  pUVar35 = this->theCoPvec;
  *(ulong *)((pUVar35->theval).m_backend.data._M_elems + 8) =
       CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
  *(ulong *)((pUVar35->theval).m_backend.data._M_elems + 4) =
       CONCAT44(result.m_backend.data._M_elems[5],result.m_backend.data._M_elems[4]);
  *(ulong *)((pUVar35->theval).m_backend.data._M_elems + 6) =
       CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
  *(undefined8 *)(pUVar35->theval).m_backend.data._M_elems = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((pUVar35->theval).m_backend.data._M_elems + 2) =
       result.m_backend.data._M_elems._8_8_;
  (pUVar35->theval).m_backend.exp = result.m_backend.exp;
  (pUVar35->theval).m_backend.neg = result.m_backend.neg;
  (pUVar35->theval).m_backend.fpclass = result.m_backend.fpclass;
  (pUVar35->theval).m_backend.prec_elem = result.m_backend.prec_elem;
  pUVar35 = this->theCoPvec;
  RVar42 = Tolerances::epsilon((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 10;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems._32_5_ = 0;
  result.m_backend.data._M_elems[9]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&result,RVar42);
  if ((((pUVar35->theval).m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&(pUVar35->theval).m_backend,&result.m_backend), iVar24 < 1)) {
    pUVar35 = this->theCoPvec;
    RVar42 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    result_11.m_backend.fpclass = cpp_dec_float_finite;
    result_11.m_backend.prec_elem = 10;
    result_11.m_backend.data._M_elems[0] = 0;
    result_11.m_backend.data._M_elems[1] = 0;
    result_11.m_backend.data._M_elems[2] = 0;
    result_11.m_backend.data._M_elems[3] = 0;
    result_11.m_backend.data._M_elems[4] = 0;
    result_11.m_backend.data._M_elems[5] = 0;
    result_11.m_backend.data._M_elems[6] = 0;
    result_11.m_backend.data._M_elems[7] = 0;
    result_11.m_backend.data._M_elems._32_5_ = 0;
    result_11.m_backend.data._M_elems[9]._1_3_ = 0;
    result_11.m_backend.exp = 0;
    result_11.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_11,RVar42);
    leavebound.m_backend.data._M_elems[0] = result_11.m_backend.data._M_elems[0];
    leavebound.m_backend.data._M_elems[1] = result_11.m_backend.data._M_elems[1];
    uVar10 = leavebound.m_backend.data._M_elems._0_8_;
    leavebound.m_backend.data._M_elems[2] = result_11.m_backend.data._M_elems[2];
    leavebound.m_backend.data._M_elems[3] = result_11.m_backend.data._M_elems[3];
    leavebound.m_backend.data._M_elems[4] = result_11.m_backend.data._M_elems[4];
    leavebound.m_backend.data._M_elems[5] = result_11.m_backend.data._M_elems[5];
    leavebound.m_backend.data._M_elems[6] = result_11.m_backend.data._M_elems[6];
    leavebound.m_backend.data._M_elems[7] = result_11.m_backend.data._M_elems[7];
    leavebound.m_backend.data._M_elems._32_5_ = result_11.m_backend.data._M_elems._32_5_;
    leavebound.m_backend.data._M_elems[9]._1_3_ = result_11.m_backend.data._M_elems[9]._1_3_;
    leavebound.m_backend.exp = result_11.m_backend.exp;
    leavebound.m_backend.neg = result_11.m_backend.neg;
    leavebound.m_backend.fpclass = result_11.m_backend.fpclass;
    leavebound.m_backend.prec_elem = result_11.m_backend.prec_elem;
    leavebound.m_backend.data._M_elems[0] = result_11.m_backend.data._M_elems[0];
    if (leavebound.m_backend.data._M_elems[0] != 0 ||
        result_11.m_backend.fpclass != cpp_dec_float_finite) {
      leavebound.m_backend.neg = (bool)(result_11.m_backend.neg ^ 1);
    }
    if (((result_11.m_backend.fpclass != cpp_dec_float_NaN) &&
        ((pUVar35->theval).m_backend.fpclass != cpp_dec_float_NaN)) &&
       (leavebound.m_backend.data._M_elems._0_8_ = uVar10,
       iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&(pUVar35->theval).m_backend,&leavebound.m_backend), iVar24 < 0))
    goto LAB_00283ca6;
  }
  else {
LAB_00283ca6:
    if (this->thePricing == FULL) {
      pUVar35 = this->theCoPvec;
      pUVar12 = this->thePvec;
      *(undefined8 *)((pUVar12->theval).m_backend.data._M_elems + 8) =
           *(undefined8 *)((pUVar35->theval).m_backend.data._M_elems + 8);
      uVar10 = *(undefined8 *)(pUVar35->theval).m_backend.data._M_elems;
      uVar17 = *(undefined8 *)((pUVar35->theval).m_backend.data._M_elems + 2);
      uVar39 = (pUVar35->theval).m_backend.data._M_elems[5];
      uVar15 = (pUVar35->theval).m_backend.data._M_elems[6];
      uVar16 = (pUVar35->theval).m_backend.data._M_elems[7];
      (pUVar12->theval).m_backend.data._M_elems[4] = (pUVar35->theval).m_backend.data._M_elems[4];
      (pUVar12->theval).m_backend.data._M_elems[5] = uVar39;
      (pUVar12->theval).m_backend.data._M_elems[6] = uVar15;
      (pUVar12->theval).m_backend.data._M_elems[7] = uVar16;
      *(undefined8 *)(pUVar12->theval).m_backend.data._M_elems = uVar10;
      *(undefined8 *)((pUVar12->theval).m_backend.data._M_elems + 2) = uVar17;
      (pUVar12->theval).m_backend.exp = (pUVar35->theval).m_backend.exp;
      (pUVar12->theval).m_backend.neg = (pUVar35->theval).m_backend.neg;
      iVar20 = (pUVar35->theval).m_backend.prec_elem;
      (pUVar12->theval).m_backend.fpclass = (pUVar35->theval).m_backend.fpclass;
      (pUVar12->theval).m_backend.prec_elem = iVar20;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x86])(this);
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x87])(this);
  }
  leavebound.m_backend.fpclass = cpp_dec_float_finite;
  leavebound.m_backend.prec_elem = 10;
  leavebound.m_backend.data._M_elems[0] = 0;
  leavebound.m_backend.data._M_elems[1] = 0;
  leavebound.m_backend.data._M_elems[2] = 0;
  leavebound.m_backend.data._M_elems[3] = 0;
  leavebound.m_backend.data._M_elems[4] = 0;
  leavebound.m_backend.data._M_elems[5] = 0;
  leavebound.m_backend.data._M_elems[6] = 0;
  leavebound.m_backend.data._M_elems[7] = 0;
  leavebound.m_backend.data._M_elems._32_5_ = 0;
  leavebound.m_backend.data._M_elems[9]._1_3_ = 0;
  leavebound.m_backend.exp = 0;
  leavebound.m_backend.neg = false;
  local_168[0] = enterMax.m_backend.data._M_elems[0];
  local_168[1] = enterMax.m_backend.data._M_elems[1];
  auStack_160[0] = enterMax.m_backend.data._M_elems[2];
  auStack_160[1] = enterMax.m_backend.data._M_elems[3];
  local_158 = enterMax.m_backend.data._M_elems[4];
  uStack_154 = enterMax.m_backend.data._M_elems[5];
  uStack_150 = enterMax.m_backend.data._M_elems[6];
  uStack_14c = enterMax.m_backend.data._M_elems[7];
  local_148 = CONCAT35(enterMax.m_backend.data._M_elems[9]._1_3_,
                       enterMax.m_backend.data._M_elems._32_5_);
  local_140 = enterMax.m_backend.exp;
  local_13c = enterMax.m_backend.neg;
  local_138 = enterMax.m_backend.fpclass;
  iStack_134 = enterMax.m_backend.prec_elem;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x82])(this,(ulong)uVar25,local_168,&leavebound,local_4e8);
  pnVar9 = (this->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar9[uVar33].m_backend.data._M_elems + 8) =
       CONCAT35(enterUB.m_backend.data._M_elems[9]._1_3_,enterUB.m_backend.data._M_elems._32_5_);
  puVar1 = pnVar9[uVar33].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = enterUB.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(enterUB.m_backend.data._M_elems[7]._1_3_,enterUB.m_backend.data._M_elems._24_5_);
  *(undefined8 *)&pnVar9[uVar33].m_backend.data = enterUB.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar9[uVar33].m_backend.data._M_elems + 2) =
       enterUB.m_backend.data._M_elems._8_8_;
  pnVar9[uVar33].m_backend.exp = enterUB.m_backend.exp;
  pnVar9[uVar33].m_backend.neg = enterUB.m_backend.neg;
  pnVar9[uVar33].m_backend.fpclass = enterUB.m_backend.fpclass;
  pnVar9[uVar33].m_backend.prec_elem = enterUB.m_backend.prec_elem;
  pnVar9 = (this->theLBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar9[uVar33].m_backend.data._M_elems + 8) =
       CONCAT35(enterLB.m_backend.data._M_elems[9]._1_3_,enterLB.m_backend.data._M_elems._32_5_);
  puVar1 = pnVar9[uVar33].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = enterLB.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(enterLB.m_backend.data._M_elems[7]._1_3_,enterLB.m_backend.data._M_elems._24_5_);
  *(undefined8 *)&pnVar9[uVar33].m_backend.data = enterLB.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar9[uVar33].m_backend.data._M_elems + 2) =
       enterLB.m_backend.data._M_elems._8_8_;
  pnVar9[uVar33].m_backend.exp = enterLB.m_backend.exp;
  pnVar9[uVar33].m_backend.neg = enterLB.m_backend.neg;
  pnVar9[uVar33].m_backend.fpclass = enterLB.m_backend.fpclass;
  pnVar9[uVar33].m_backend.prec_elem = enterLB.m_backend.prec_elem;
  updateCoTest(this);
  if (this->thePricing == FULL) {
    updateTest(this);
  }
  pUVar35 = this->theFvec;
  *(ulong *)((pUVar35->theval).m_backend.data._M_elems + 8) =
       CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,result_1.m_backend.data._M_elems._32_5_);
  *(undefined8 *)((pUVar35->theval).m_backend.data._M_elems + 4) =
       result_1.m_backend.data._M_elems._16_8_;
  *(ulong *)((pUVar35->theval).m_backend.data._M_elems + 6) =
       CONCAT44(result_1.m_backend.data._M_elems[7],result_1.m_backend.data._M_elems[6]);
  *(undefined8 *)(pUVar35->theval).m_backend.data._M_elems = result_1.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((pUVar35->theval).m_backend.data._M_elems + 2) =
       result_1.m_backend.data._M_elems._8_8_;
  (pUVar35->theval).m_backend.exp = result_1.m_backend.exp;
  (pUVar35->theval).m_backend.neg = result_1.m_backend.neg;
  (pUVar35->theval).m_backend.fpclass = result_1.m_backend.fpclass;
  (pUVar35->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
  pUVar35 = this->theFvec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)pUVar35,&pUVar35->theval,&pUVar35->thedelta);
  result.m_backend.data._M_elems._32_5_ = enterVal.m_backend.data._M_elems._32_5_;
  result.m_backend.data._M_elems[9]._1_3_ = enterVal.m_backend.data._M_elems[9]._1_3_;
  result.m_backend.data._M_elems[4] = enterVal.m_backend.data._M_elems[4];
  result.m_backend.data._M_elems[5] = enterVal.m_backend.data._M_elems[5];
  result.m_backend.data._M_elems[6] = enterVal.m_backend.data._M_elems[6];
  result.m_backend.data._M_elems[7] =
       (uint)(CONCAT35(enterVal.m_backend.data._M_elems[7]._1_3_,
                       enterVal.m_backend.data._M_elems._24_5_) >> 0x20);
  result.m_backend.data._M_elems[0] = enterVal.m_backend.data._M_elems[0];
  result.m_backend.data._M_elems[1] = enterVal.m_backend.data._M_elems[1];
  result.m_backend.data._M_elems[2] = enterVal.m_backend.data._M_elems[2];
  result.m_backend.data._M_elems[3] = enterVal.m_backend.data._M_elems[3];
  result.m_backend.exp = enterVal.m_backend.exp;
  result.m_backend.neg = enterVal.m_backend.neg;
  result.m_backend.fpclass = enterVal.m_backend.fpclass;
  result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            (&result.m_backend,&result_1.m_backend);
  pnVar9 = (this->theFvec->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar9[uVar33].m_backend.data._M_elems + 8) =
       CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
  puVar1 = pnVar9[uVar33].m_backend.data._M_elems + 4;
  *(ulong *)puVar1 = CONCAT44(result.m_backend.data._M_elems[5],result.m_backend.data._M_elems[4]);
  *(ulong *)(puVar1 + 2) =
       CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
  *(undefined8 *)&pnVar9[uVar33].m_backend = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar9[uVar33].m_backend.data._M_elems + 2) = result.m_backend.data._M_elems._8_8_
  ;
  pnVar9[uVar33].m_backend.exp = result.m_backend.exp;
  pnVar9[uVar33].m_backend.neg = result.m_backend.neg;
  pnVar9[uVar33].m_backend.fpclass = result.m_backend.fpclass;
  pnVar9[uVar33].m_backend.prec_elem = result.m_backend.prec_elem;
  RVar42 = Tolerances::epsilon((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 10;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems._32_5_ = 0;
  result.m_backend.data._M_elems[9]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&result.m_backend,RVar42);
  if (((leavebound.m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&leavebound.m_backend,&result.m_backend), iVar24 < 1)) {
    RVar42 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    local_3b8._0_4_ = cpp_dec_float_finite;
    local_3b8._4_4_ = 10;
    local_3e8._0_4_ = 0;
    local_3e8._4_4_ = 0;
    auStack_3e0[0] = 0;
    auStack_3e0[1] = 0;
    auStack_3e0[2] = 0;
    auStack_3e0[3] = 0;
    uStack_3d0 = 0;
    uStack_3cb = 0;
    _local_3c8 = 0;
    uStack_3c3 = 0;
    local_3c0 = 0;
    local_3bc = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,RVar42);
    result_11.m_backend.data._M_elems[0] = (uint)local_3e8;
    result_11.m_backend.data._M_elems[1] = local_3e8._4_4_;
    uVar10 = result_11.m_backend.data._M_elems._0_8_;
    result_11.m_backend.data._M_elems[2] = auStack_3e0[0];
    result_11.m_backend.data._M_elems[3] = auStack_3e0[1];
    result_11.m_backend.data._M_elems[4] = auStack_3e0[2];
    result_11.m_backend.data._M_elems[5] = auStack_3e0[3];
    result_11.m_backend.data._M_elems[6] = (uint)uStack_3d0;
    result_11.m_backend.data._M_elems[7] = (uint)(CONCAT35(uStack_3cb,uStack_3d0) >> 0x20);
    result_11.m_backend.data._M_elems._32_5_ = _local_3c8;
    result_11.m_backend.data._M_elems[9]._1_3_ = uStack_3c3;
    result_11.m_backend.exp = local_3c0;
    result_11.m_backend.neg = (bool)local_3bc;
    result_11.m_backend.fpclass = (fpclass_type)local_3b8;
    result_11.m_backend.prec_elem = local_3b8._4_4_;
    result_11.m_backend.data._M_elems[0] = (uint)local_3e8;
    if (result_11.m_backend.data._M_elems[0] != 0 || (fpclass_type)local_3b8 != cpp_dec_float_finite
       ) {
      result_11.m_backend.neg = (bool)(local_3bc ^ 1);
    }
    result_11.m_backend.data._M_elems._0_8_ = uVar10;
    if ((((fpclass_type)local_3b8 != cpp_dec_float_NaN) &&
        (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&leavebound.m_backend,&result_11.m_backend), iVar24 < 0))
    goto LAB_00284079;
  }
  else {
LAB_00284079:
    pVVar13 = this->theFrhs;
    result_11.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
    result_11.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
    uVar10 = result_11.m_backend.data._M_elems._0_8_;
    result_11.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
    result_11.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
    result_11.m_backend.data._M_elems._32_5_ = leavebound.m_backend.data._M_elems._32_5_;
    result_11.m_backend.data._M_elems[9]._1_3_ = leavebound.m_backend.data._M_elems[9]._1_3_;
    result_11.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
    result_11.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
    result_11.m_backend.data._M_elems[6] = leavebound.m_backend.data._M_elems[6];
    result_11.m_backend.data._M_elems[7] = leavebound.m_backend.data._M_elems[7];
    result_11.m_backend.exp = leavebound.m_backend.exp;
    result_11.m_backend.neg = leavebound.m_backend.neg;
    result_11.m_backend.fpclass = leavebound.m_backend.fpclass;
    result_11.m_backend.prec_elem = leavebound.m_backend.prec_elem;
    result_11.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
    if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
        result_11.m_backend.data._M_elems[0] != 0) {
      result_11.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
    }
    pSVar14 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).matrix.data[local_770];
    lVar30 = (long)pSVar14->memused;
    result_11.m_backend.data._M_elems._0_8_ = uVar10;
    if (0 < lVar30) {
      uVar33 = lVar30 + 1;
      lVar30 = lVar30 * 0x3c;
      do {
        pcVar29 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)pSVar14->m_elem[-1].val.m_backend.data._M_elems + lVar30);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        pcVar31 = &result_11.m_backend;
        if (pcVar29 != &result.m_backend) {
          result.m_backend.data._M_elems._32_5_ = result_11.m_backend.data._M_elems._32_5_;
          result.m_backend.data._M_elems[9]._1_3_ = result_11.m_backend.data._M_elems[9]._1_3_;
          result.m_backend.data._M_elems[4] = result_11.m_backend.data._M_elems[4];
          result.m_backend.data._M_elems[5] = result_11.m_backend.data._M_elems[5];
          result.m_backend.data._M_elems[6] = result_11.m_backend.data._M_elems[6];
          result.m_backend.data._M_elems[7] = result_11.m_backend.data._M_elems[7];
          result.m_backend.data._M_elems[2] = result_11.m_backend.data._M_elems[2];
          result.m_backend.data._M_elems[3] = result_11.m_backend.data._M_elems[3];
          result.m_backend.data._M_elems[0] = result_11.m_backend.data._M_elems[0];
          result.m_backend.data._M_elems[1] = result_11.m_backend.data._M_elems[1];
          result.m_backend.exp = result_11.m_backend.exp;
          result.m_backend.neg = result_11.m_backend.neg;
          result.m_backend.fpclass = result_11.m_backend.fpclass;
          result.m_backend.prec_elem = result_11.m_backend.prec_elem;
          pcVar31 = pcVar29;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result.m_backend,pcVar31);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&(pVVar13->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pSVar14->m_elem[-1].val + 1) + lVar30)].m_backend,
                   &result.m_backend);
        uVar33 = uVar33 - 1;
        lVar30 = lVar30 + -0x3c;
      } while (1 < uVar33);
    }
  }
  RVar42 = Tolerances::epsilon((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 10;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems._32_5_ = 0;
  result.m_backend.data._M_elems[9]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&result.m_backend,RVar42);
  if (((enterVal.m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&enterVal.m_backend,&result.m_backend), iVar24 < 1)) {
    RVar42 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    local_3b8._0_4_ = cpp_dec_float_finite;
    local_3b8._4_4_ = 10;
    local_3e8._0_4_ = 0;
    local_3e8._4_4_ = 0;
    auStack_3e0[0] = 0;
    auStack_3e0[1] = 0;
    auStack_3e0[2] = 0;
    auStack_3e0[3] = 0;
    uStack_3d0 = 0;
    uStack_3cb = 0;
    _local_3c8 = 0;
    uStack_3c3 = 0;
    local_3c0 = 0;
    local_3bc = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,RVar42);
    result_11.m_backend.data._M_elems[0] = (uint)local_3e8;
    result_11.m_backend.data._M_elems[1] = local_3e8._4_4_;
    uVar10 = result_11.m_backend.data._M_elems._0_8_;
    result_11.m_backend.data._M_elems[2] = auStack_3e0[0];
    result_11.m_backend.data._M_elems[3] = auStack_3e0[1];
    result_11.m_backend.data._M_elems[4] = auStack_3e0[2];
    result_11.m_backend.data._M_elems[5] = auStack_3e0[3];
    result_11.m_backend.data._M_elems[6] = (uint)uStack_3d0;
    result_11.m_backend.data._M_elems[7] = (uint)(CONCAT35(uStack_3cb,uStack_3d0) >> 0x20);
    result_11.m_backend.data._M_elems._32_5_ = _local_3c8;
    result_11.m_backend.data._M_elems[9]._1_3_ = uStack_3c3;
    result_11.m_backend.exp = local_3c0;
    result_11.m_backend.neg = (bool)local_3bc;
    result_11.m_backend.fpclass = (fpclass_type)local_3b8;
    result_11.m_backend.prec_elem = local_3b8._4_4_;
    result_11.m_backend.data._M_elems[0] = (uint)local_3e8;
    if (result_11.m_backend.data._M_elems[0] != 0 || (fpclass_type)local_3b8 != cpp_dec_float_finite
       ) {
      result_11.m_backend.neg = (bool)(local_3bc ^ 1);
    }
    result_11.m_backend.data._M_elems._0_8_ = uVar10;
    if ((((fpclass_type)local_3b8 == cpp_dec_float_NaN) ||
        (enterVal.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&enterVal.m_backend,&result_11.m_backend), -1 < iVar24))
    goto LAB_002843c0;
  }
  lVar30 = (long)rhs->memused;
  if (0 < lVar30) {
    pVVar13 = this->theFrhs;
    uVar33 = lVar30 + 1;
    lVar30 = lVar30 * 0x3c;
    do {
      pcVar29 = (cpp_dec_float<50U,_int,_void> *)
                ((long)rhs->m_elem[-1].val.m_backend.data._M_elems + lVar30);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      pcVar31 = &enterVal.m_backend;
      if (pcVar29 != &result.m_backend) {
        result.m_backend.data._M_elems._32_5_ = enterVal.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = enterVal.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.data._M_elems[4] = enterVal.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = enterVal.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems[6] = enterVal.m_backend.data._M_elems[6];
        result.m_backend.data._M_elems[7] =
             (uint)(CONCAT35(enterVal.m_backend.data._M_elems[7]._1_3_,
                             enterVal.m_backend.data._M_elems._24_5_) >> 0x20);
        result.m_backend.data._M_elems[2] = enterVal.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = enterVal.m_backend.data._M_elems[3];
        result.m_backend.data._M_elems[0] = enterVal.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = enterVal.m_backend.data._M_elems[1];
        result.m_backend.exp = enterVal.m_backend.exp;
        result.m_backend.neg = enterVal.m_backend.neg;
        result.m_backend.fpclass = enterVal.m_backend.fpclass;
        result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
        pcVar31 = pcVar29;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result.m_backend,pcVar31);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(pVVar13->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&rhs->m_elem[-1].val + 1) + lVar30)].m_backend,&result.m_backend)
      ;
      uVar33 = uVar33 - 1;
      lVar30 = lVar30 + -0x3c;
    } while (1 < uVar33);
  }
LAB_002843c0:
  local_1e8[0].m_backend.data._M_elems[9]._1_3_ = uStack_4c3;
  local_1e8[0].m_backend.data._M_elems._32_5_ = local_4c8;
  local_1e8[0].m_backend.data._M_elems[7]._1_3_ = uStack_4cb;
  local_1e8[0].m_backend.data._M_elems._24_5_ = uStack_4d0;
  local_1e8[0].m_backend.data._M_elems[4] = local_4e8[4];
  local_1e8[0].m_backend.data._M_elems[5] = local_4e8[5];
  local_1e8[0].m_backend.data._M_elems[0] = local_4e8[0];
  local_1e8[0].m_backend.data._M_elems[1] = local_4e8[1];
  local_1e8[0].m_backend.data._M_elems[2] = local_4e8[2];
  local_1e8[0].m_backend.data._M_elems[3] = local_4e8[3];
  local_1e8[0].m_backend.exp = local_4c0;
  local_1e8[0].m_backend.neg = (bool)local_4bc;
  local_1e8[0].m_backend.fpclass = (fpclass_type)local_4b8;
  local_1e8[0].m_backend.prec_elem = local_4b8._4_4_;
  updateNonbasicValue(this,local_1e8);
  (**(this->
     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxBasisBase)
            (&this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,(ulong)uVar25,local_778,rhs,&this->theFvec->thedelta);
  return bVar41;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}